

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O3

MethodText * __thiscall
capnp::anon_unknown_1::CapnpcCppMain::makeMethodText
          (MethodText *__return_storage_ptr__,CapnpcCppMain *this,StringPtr interfaceName,
          Method method,TemplateContext *templateContext)

{
  StringTree *__return_storage_ptr___00;
  undefined8 uVar1;
  Method MVar2;
  WirePointer *pWVar3;
  kj *firstElement;
  CapnpcCppMain *pCVar4;
  undefined8 uVar5;
  Branch *pBVar6;
  int iVar7;
  const_iterator cVar8;
  kj *pkVar9;
  MethodText *pMVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  MethodText *extraout_RAX;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  ulong uVar11;
  String *params_1;
  Schema params;
  CppTypeName *pCVar12;
  CppTypeName *pCVar13;
  Array<capnp::(anonymous_namespace)::CppTypeName> *params_00;
  Array<capnp::(anonymous_namespace)::CppTypeName> *pAVar14;
  CppTypeName *extraout_RDX;
  CppTypeName *extraout_RDX_00;
  CppTypeName *extraout_RDX_01;
  CppTypeName *extraout_RDX_02;
  CppTypeName *extraout_RDX_03;
  CppTypeName *extraout_RDX_04;
  CppTypeName *extraout_RDX_06;
  CppTypeName *extraout_RDX_07;
  CppTypeName *extraout_RDX_08;
  CppTypeName *extraout_RDX_09;
  CppTypeName *extraout_RDX_10;
  CppTypeName *value;
  CppTypeName *value_00;
  CppTypeName *value_01;
  CppTypeName *value_02;
  CppTypeName *value_03;
  CppTypeName *value_04;
  CppTypeName *extraout_RDX_11;
  CppTypeName *extraout_RDX_12;
  CppTypeName *extraout_RDX_13;
  CppTypeName *extraout_RDX_14;
  CppTypeName *extraout_RDX_15;
  CppTypeName *extraout_RDX_16;
  CppTypeName *value_05;
  char *pcVar15;
  CppTypeName *capacity;
  long lVar16;
  ArrayDisposer *__s;
  ElementCount index;
  SegmentReader *pSVar17;
  char *pcVar18;
  unsigned_long i;
  char (*params_2) [3];
  char (*pacVar19) [3];
  CapTableReader *pCVar20;
  kj *pkVar21;
  char *pcVar22;
  undefined4 uVar23;
  char *pcVar24;
  char *pcVar25;
  bool bVar26;
  size_t sVar27;
  StringPtr innerName;
  StringPtr innerName_00;
  StringPtr innerName_01;
  StringPtr innerName_02;
  StringPtr innerName_03;
  StringPtr innerName_04;
  initializer_list<kj::StringPtr> __l;
  StringPtr name_00;
  StringPtr delim;
  ArrayPtr<capnp::(anonymous_namespace)::CppTypeName> content;
  ArrayPtr<capnp::(anonymous_namespace)::CppTypeName> content_00;
  Reader RVar28;
  ArrayPtr<const_char> *params_11;
  undefined6 uStack_b38;
  uint16_t methodId;
  kj *local_b30;
  CppTypeName *local_b28;
  CapnpcCppMain *local_b20;
  undefined1 local_b18 [40];
  CppTypeName *pCStack_af0;
  ArrayDisposer *local_ae8;
  String titleCase;
  CppTypeName resultType;
  PointerReader local_a78;
  undefined1 local_a58 [16];
  undefined1 local_a48 [32];
  undefined1 local_a28 [24];
  size_t local_a10;
  undefined1 local_a08 [16];
  undefined1 local_9f8 [16];
  undefined1 local_9e8 [16];
  undefined1 local_9d8 [32];
  undefined1 auStack_9b8 [16];
  ArrayDisposer *pAStack_9a8;
  undefined1 local_998 [40];
  size_t sStack_970;
  ArrayDisposer *local_968;
  String identifierName;
  StructSchema resultSchema;
  StructSchema paramSchema;
  StringPtr name;
  CppTypeName paramType;
  CppTypeName interfaceTypeName;
  undefined1 local_888 [40];
  size_t sStack_860;
  ArrayDisposer *local_858;
  undefined1 local_848 [16];
  kj *local_838;
  undefined8 *local_830;
  String shortResultType;
  String shortParamType;
  String implicitParamsTemplateDecl;
  ArrayPtr<const_char> local_7c8;
  undefined1 local_7b8 [16];
  CppTypeName genericParamType;
  CppTypeName genericResultType;
  Array<capnp::(anonymous_namespace)::CppTypeName> implicitParams;
  StringPtr interfaceName_local;
  ArrayPtr<const_char> local_6c8;
  ArrayPtr<const_char> local_6b8;
  undefined1 local_6a8 [24];
  undefined8 local_690;
  ArrayPtr<const_char> local_688;
  Reader interfaceProto;
  Reader resultProto;
  Reader paramProto;
  CappedArray<char,_17UL> interfaceIdHex;
  Reader implicitParamsReader;
  StringTree requestMethodImpl;
  CappedArray<char,_8UL> local_50;
  CappedArray<char,_8UL> local_40;
  CppTypeName *extraout_RDX_05;
  
  MVar2 = method;
  local_848._8_8_ = local_848._0_8_;
  interfaceTypeName.name.text.content.size_ = (size_t)interfaceTypeName.name.text.content.ptr;
  pSVar17 = method.proto._reader.segment;
  pCVar20 = method.proto._reader.capTable;
  pWVar3 = method.proto._reader.pointers;
  uVar23 = method.proto._reader._36_4_;
  interfaceName_local.content.size_ = interfaceName.content.size_;
  interfaceName_local.content.ptr = interfaceName.content.ptr;
  uVar11 = (ulong)method.proto._reader.dataSize;
  local_b20 = this;
  name = protoName<capnp::schema::Method::Reader>
                   ((CapnpcCppMain *)__return_storage_ptr__,method.proto._reader);
  name_00.content.ptr = (char *)name.content.size_;
  name_00.content.size_ = uVar11;
  toTitleCase(&titleCase,(CapnpcCppMain *)name.content.ptr,name_00);
  paramSchema = InterfaceSchema::Method::getParamType(&method);
  resultSchema = InterfaceSchema::Method::getResultType(&method);
  interfaceTypeName.name.size_ = (size_t)name.content.ptr;
  interfaceTypeName.name.text.content.ptr = (char *)name.content.size_;
  if (((anonymous_namespace)::safeIdentifier(kj::StringPtr)::keywords == '\0') &&
     (iVar7 = __cxa_guard_acquire(&(anonymous_namespace)::safeIdentifier(kj::StringPtr)::keywords),
     iVar7 != 0)) {
    local_b30 = (kj *)CONCAT44(local_b30._4_4_,uVar23);
    requestMethodImpl.size_._0_1_ = 0xe4;
    requestMethodImpl.size_._1_7_ = 0x223b;
    requestMethodImpl.text.content.ptr = (char *)0x8;
    requestMethodImpl.text.content.size_ = (size_t)anon_var_dwarf_82788;
    requestMethodImpl.text.content.disposer = (ArrayDisposer *)0x8;
    requestMethodImpl.branches.size_ = 4;
    requestMethodImpl.branches.ptr = (Branch *)0x23451e;
    requestMethodImpl.branches.disposer = (ArrayDisposer *)anon_var_dwarf_8279e;
    __l._M_len = 0x54;
    __l._M_array = (iterator)&requestMethodImpl;
    std::set<kj::StringPtr,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_>::set
              ((set<kj::StringPtr,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_> *)
               (anonymous_namespace)::safeIdentifier(kj::StringPtr)::keywords,__l,
               (less<kj::StringPtr> *)&paramType,(allocator_type *)&genericParamType);
    __cxa_atexit(std::set<kj::StringPtr,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_>::
                 ~set,(anonymous_namespace)::safeIdentifier(kj::StringPtr)::keywords,&__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::safeIdentifier(kj::StringPtr)::keywords);
    uVar23 = local_b30._0_4_;
  }
  cVar8 = std::
          _Rb_tree<kj::StringPtr,_kj::StringPtr,_std::_Identity<kj::StringPtr>,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_>
          ::find((_Rb_tree<kj::StringPtr,_kj::StringPtr,_std::_Identity<kj::StringPtr>,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_>
                  *)(anonymous_namespace)::safeIdentifier(kj::StringPtr)::keywords,
                 (key_type *)&interfaceTypeName);
  pcVar15 = interfaceTypeName.name.text.content.ptr;
  if (cVar8._M_node ==
      (_Base_ptr)((anonymous_namespace)::safeIdentifier(kj::StringPtr)::keywords + 8)) {
    kj::heapString(&identifierName,(char *)interfaceTypeName.name.size_,
                   (size_t)(interfaceTypeName.name.text.content.ptr + -1));
  }
  else {
    local_b28 = (CppTypeName *)interfaceTypeName.name.size_;
    kj::heapString(&identifierName,(size_t)interfaceTypeName.name.text.content.ptr);
    local_b30 = (kj *)CONCAT44(local_b30._4_4_,uVar23);
    pcVar15 = pcVar15 + -1;
    pcVar25 = (char *)identifierName.content.size_;
    if (identifierName.content.size_ != 0) {
      pcVar25 = identifierName.content.ptr;
    }
    if (pcVar15 != (char *)0x0) {
      memcpy(pcVar25,local_b28,(size_t)pcVar15);
      pcVar25 = pcVar25 + (long)pcVar15;
    }
    *pcVar25 = '_';
    uVar23 = local_b30._0_4_;
  }
  Schema::getProto(&paramProto,&paramSchema.super_Schema);
  Schema::getProto(&resultProto,&resultSchema.super_Schema);
  if ((ushort)uVar23 < 5) {
    iVar7 = 0x7fffffff;
    pCVar20 = (CapTableReader *)0x0;
    requestMethodImpl.text.content.size_ = 0;
    pSVar17 = (SegmentReader *)0x0;
  }
  else {
    requestMethodImpl.text.content.size_ = (size_t)(pWVar3 + 4);
    iVar7 = MVar2.proto._reader.nestingLimit;
  }
  requestMethodImpl.size_._0_1_ = SUB81(pSVar17,0);
  requestMethodImpl.size_._1_7_ = (undefined7)((ulong)pSVar17 >> 8);
  requestMethodImpl.text.content.disposer =
       (ArrayDisposer *)CONCAT44(requestMethodImpl.text.content.disposer._4_4_,iVar7);
  requestMethodImpl.text.content.ptr = (char *)pCVar20;
  _::PointerReader::getList
            (&implicitParamsReader.reader,(PointerReader *)&requestMethodImpl,INLINE_COMPOSITE,
             (word *)0x0);
  uVar11 = (ulong)implicitParamsReader.reader.elementCount;
  pkVar9 = (kj *)kj::_::HeapArrayDisposer::allocateImpl
                           (0x40,0,uVar11,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_848._0_8_ = pkVar9;
  local_838 = pkVar9 + uVar11 * 0x40;
  local_830 = &kj::_::HeapArrayDisposer::instance;
  local_b30 = pkVar9;
  if (implicitParamsReader.reader.elementCount != 0) {
    index = 0;
    do {
      _::ListReader::getStructElement
                ((StructReader *)&interfaceTypeName,&implicitParamsReader.reader,index);
      bVar26 = interfaceTypeName.name.branches.ptr._4_2_ == 0;
      requestMethodImpl.text.content.size_ = (size_t)interfaceTypeName.name.text.content.disposer;
      if (bVar26) {
        requestMethodImpl.text.content.size_ = 0;
      }
      uVar23 = (undefined4)interfaceTypeName.name.branches.size_;
      if (bVar26) {
        uVar23 = 0x7fffffff;
      }
      sVar27 = 0;
      requestMethodImpl.text.content.ptr = (char *)0x0;
      if (!bVar26) {
        sVar27 = interfaceTypeName.name.size_;
        requestMethodImpl.text.content.ptr = interfaceTypeName.name.text.content.ptr;
      }
      requestMethodImpl.size_._0_1_ = (undefined1)sVar27;
      requestMethodImpl.size_._1_7_ = (undefined7)(sVar27 >> 8);
      requestMethodImpl.text.content.disposer =
           (ArrayDisposer *)CONCAT44(requestMethodImpl.text.content.disposer._4_4_,uVar23);
      RVar28 = _::PointerReader::getBlob<capnp::Text>
                         ((PointerReader *)&requestMethodImpl,(void *)0x0,0);
      paramType.name.size_ = RVar28.super_StringPtr.content.ptr;
      paramType.name.text.content.ptr = (char *)(RVar28.super_StringPtr.content.size_ - 1);
      kj::StringTree::concat<kj::ArrayPtr<char_const>>
                (&requestMethodImpl,&paramType.name,
                 (ArrayPtr<const_char> *)paramType.name.text.content.ptr);
      *(ulong *)pkVar9 = CONCAT71(requestMethodImpl.size_._1_7_,(undefined1)requestMethodImpl.size_)
      ;
      *(char **)(pkVar9 + 8) = requestMethodImpl.text.content.ptr;
      *(size_t *)(pkVar9 + 0x10) = requestMethodImpl.text.content.size_;
      *(ArrayDisposer **)(pkVar9 + 0x18) = requestMethodImpl.text.content.disposer;
      *(Branch **)(pkVar9 + 0x20) = requestMethodImpl.branches.ptr;
      *(size_t *)(pkVar9 + 0x28) = requestMethodImpl.branches.size_;
      *(ArrayDisposer **)(pkVar9 + 0x30) = requestMethodImpl.branches.disposer;
      *(undefined4 *)(pkVar9 + 0x38) = 1;
      pkVar9 = pkVar9 + 0x40;
      index = index + 1;
    } while (implicitParamsReader.reader.elementCount != index);
  }
  firstElement = local_b30;
  capacity = (CppTypeName *)((long)pkVar9 - (long)local_b30 >> 6);
  local_848 = (undefined1  [16])0x0;
  local_838 = (kj *)0x0;
  implicitParamsTemplateDecl.content.disposer = (ArrayDisposer *)0x0;
  implicitParamsTemplateDecl.content.ptr = (char *)0x0;
  local_b28 = capacity;
  if (pkVar9 == local_b30) {
    pcVar15 = (char *)0x0;
    pkVar21 = local_b30;
  }
  else {
    params_1 = (String *)0x0;
    params_2 = (char (*) [3])0x0;
    pcVar15 = (char *)kj::_::HeapArrayDisposer::allocateImpl
                                (0x38,0,(size_t)capacity,(_func_void_void_ptr *)0x0,
                                 (_func_void_void_ptr *)0x0);
    paramType.name.text.content.size_ = (size_t)(pcVar15 + (long)capacity * 0x38);
    paramType.name.text.content.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    lVar16 = 0;
    pCVar13 = extraout_RDX;
    pkVar21 = local_b30;
    paramType.name.size_ = (size_t)pcVar15;
    paramType.name.text.content.ptr = pcVar15;
    do {
      local_b18._0_8_ = "typename ";
      local_b18._8_8_ = (CppTypeName *)0x9;
      kj::toCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
                ((String *)&genericParamType,pkVar21,pCVar13);
      kj::StringTree::concat<kj::ArrayPtr<char_const>,kj::String>
                (&requestMethodImpl,(StringTree *)local_b18,
                 (ArrayPtr<const_char> *)&genericParamType,params_1);
      pacVar19 = (char (*) [3])genericParamType.name.text.content.ptr;
      sVar27 = genericParamType.name.size_;
      pCVar13 = extraout_RDX_00;
      if (genericParamType.name.size_ != 0) {
        genericParamType.name.size_ = 0;
        genericParamType.name.text.content.ptr = (char *)0x0;
        (*(code *)**(undefined8 **)genericParamType.name.text.content.size_)
                  (genericParamType.name.text.content.size_,sVar27,1,pacVar19,pacVar19,0);
        pCVar13 = extraout_RDX_01;
        params_2 = pacVar19;
      }
      pcVar25 = pcVar15 + lVar16;
      *(ulong *)pcVar25 =
           CONCAT71(requestMethodImpl.size_._1_7_,(undefined1)requestMethodImpl.size_);
      *(char **)(pcVar25 + 8) = requestMethodImpl.text.content.ptr;
      *(size_t *)(pcVar25 + 0x10) = requestMethodImpl.text.content.size_;
      requestMethodImpl.text.content.ptr = (char *)0x0;
      requestMethodImpl.text.content.size_ = 0;
      *(ArrayDisposer **)(pcVar25 + 0x18) = requestMethodImpl.text.content.disposer;
      *(Branch **)(pcVar25 + 0x20) = requestMethodImpl.branches.ptr;
      *(size_t *)(pcVar25 + 0x28) = requestMethodImpl.branches.size_;
      *(ArrayDisposer **)(pcVar25 + 0x30) = requestMethodImpl.branches.disposer;
      paramType.name.text.content.ptr = pcVar25 + 0x38;
      pkVar21 = pkVar21 + 0x40;
      lVar16 = lVar16 + 0x38;
      params_1 = (String *)requestMethodImpl.branches.disposer;
    } while (pkVar21 != pkVar9);
    genericResultType.name.text.content.ptr = (char *)((lVar16 >> 3) * 0x6db6db6db6db6db7);
    genericResultType.name.text.content.size_ = (size_t)&kj::_::HeapArrayDisposer::instance;
    delim.content.size_ = 3;
    delim.content.ptr = ", ";
    genericResultType.name.size_ = (size_t)pcVar15;
    kj::StringTree::StringTree
              (&interfaceTypeName.name,(Array<kj::StringTree> *)&genericResultType,delim);
    kj::str<char_const(&)[11],kj::StringTree,char_const(&)[3]>
              ((String *)&resultType,(kj *)"template <",(char (*) [11])&interfaceTypeName,
               (StringTree *)0x220a31,params_2);
    pcVar15 = resultType.name.text.content.ptr;
    pkVar21 = local_b30;
    pBVar6 = interfaceTypeName.name.branches.ptr;
    implicitParamsTemplateDecl.content.ptr = (char *)resultType.name.size_;
    implicitParamsTemplateDecl.content.disposer =
         (ArrayDisposer *)resultType.name.text.content.size_;
    resultType.name.size_ = 0;
    resultType.name.text.content.ptr = (char *)0x0;
    if (interfaceTypeName.name.branches.ptr != (Branch *)0x0) {
      sVar27 = interfaceTypeName.name.branches.size_;
      interfaceTypeName.name.branches.ptr = (Branch *)0x0;
      interfaceTypeName.name.branches.size_ = 0;
      (**(interfaceTypeName.name.branches.disposer)->_vptr_ArrayDisposer)
                (interfaceTypeName.name.branches.disposer,pBVar6,0x40,sVar27,sVar27,
                 kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    }
    pcVar25 = interfaceTypeName.name.text.content.ptr;
    if (interfaceTypeName.name.text.content.ptr != (char *)0x0) {
      sVar27 = interfaceTypeName.name.text.content.size_;
      interfaceTypeName.name.text.content.ptr = (char *)0x0;
      interfaceTypeName.name.text.content.size_ = 0;
      (**(interfaceTypeName.name.text.content.disposer)->_vptr_ArrayDisposer)
                (interfaceTypeName.name.text.content.disposer,pcVar25,1,sVar27,sVar27,0);
    }
    pcVar25 = genericResultType.name.text.content.ptr;
    sVar27 = genericResultType.name.size_;
    if (genericResultType.name.size_ != 0) {
      genericResultType.name.size_ = 0;
      genericResultType.name.text.content.ptr = (char *)0x0;
      (*(code *)**(undefined8 **)genericResultType.name.text.content.size_)
                (genericResultType.name.text.content.size_,sVar27,0x38,pcVar25,pcVar25,
                 kj::ArrayDisposer::Dispose_<kj::StringTree,_false>::destruct);
    }
  }
  requestMethodImpl.size_._0_1_ = 0;
  params = method.parent.super_Schema.raw;
  cppFullName(&interfaceTypeName,local_b20,method.parent.super_Schema.raw,
              method.parent.super_Schema.raw,
              (Maybe<capnp::InterfaceSchema::Method> *)&requestMethodImpl);
  paramType.name.branches.disposer = (ArrayDisposer *)0x0;
  paramType.isArgDependent = false;
  paramType.needsTypename = false;
  paramType.hasInterfaces_ = false;
  paramType.hasDisambiguatedTemplate_ = false;
  paramType.name.branches.ptr = (Branch *)0x0;
  paramType.name.branches.size_._0_4_ = 0;
  paramType.name.branches.size_._4_4_ = 0;
  paramType.name.text.content.size_ = 0;
  paramType.name.text.content.disposer = (ArrayDisposer *)0x0;
  paramType.name.size_ = 0;
  paramType.name.text.content.ptr = (char *)0x0;
  genericParamType.name.branches.disposer = (ArrayDisposer *)0x0;
  genericParamType.isArgDependent = false;
  genericParamType.needsTypename = false;
  genericParamType.hasInterfaces_ = false;
  genericParamType.hasDisambiguatedTemplate_ = false;
  genericParamType.name.branches.ptr = (Branch *)0x0;
  genericParamType.name.branches.size_._0_4_ = 0;
  genericParamType.name.branches.size_._4_4_ = 0;
  genericParamType.name.text.content.size_ = 0;
  genericParamType.name.text.content.disposer = (ArrayDisposer *)0x0;
  genericParamType.name.size_ = 0;
  genericParamType.name.text.content.ptr = (char *)0x0;
  if ((paramProto._reader.dataSize < 0xc0) || (*(long *)((long)paramProto._reader.data + 0x10) == 0)
     ) {
    CppTypeName::operator=(&paramType,&interfaceTypeName);
    if (pkVar9 == pkVar21) {
      kj::str<kj::String&,char_const(&)[7]>
                ((String *)&requestMethodImpl,(kj *)&titleCase,(String *)"Params",
                 (char (*) [7])params.raw);
      if (requestMethodImpl.text.content.ptr == (char *)0x0) {
        pcVar25 = "";
      }
      else {
        pcVar25 = (char *)CONCAT71(requestMethodImpl.size_._1_7_,(undefined1)requestMethodImpl.size_
                                  );
      }
      innerName_01.content.size_ =
           requestMethodImpl.text.content.ptr + (requestMethodImpl.text.content.ptr == (char *)0x0);
      innerName_01.content.ptr = pcVar25;
      CppTypeName::addMemberType(&paramType,innerName_01);
      pCVar13 = (CppTypeName *)requestMethodImpl.text.content.ptr;
      lVar16 = CONCAT71(requestMethodImpl.size_._1_7_,(undefined1)requestMethodImpl.size_);
      if (lVar16 != 0) {
        requestMethodImpl.size_._0_1_ = 0;
        requestMethodImpl.size_._1_7_ = 0;
        requestMethodImpl.text.content.ptr = (char *)0x0;
        (*(code *)**(undefined8 **)requestMethodImpl.text.content.size_)
                  (requestMethodImpl.text.content.size_,lVar16,1,pCVar13,pCVar13,0);
        params.raw = (RawBrandedSchema *)pCVar13;
      }
      CppTypeName::operator=(&genericParamType,&paramType);
    }
    else {
      CppTypeName::operator=(&genericParamType,&paramType);
      kj::str<kj::String&,char_const(&)[7]>
                ((String *)&requestMethodImpl,(kj *)&titleCase,(String *)"Params",
                 (char (*) [7])params.raw);
      if (requestMethodImpl.text.content.ptr == (char *)0x0) {
        pcVar25 = "";
      }
      else {
        pcVar25 = (char *)CONCAT71(requestMethodImpl.size_._1_7_,(undefined1)requestMethodImpl.size_
                                  );
      }
      innerName.content.size_ =
           requestMethodImpl.text.content.ptr + (requestMethodImpl.text.content.ptr == (char *)0x0);
      pCVar13 = &resultType;
      resultType.name.size_ = 0;
      resultType.name.text.content.ptr = (char *)0x0;
      resultType.name.text.content.size_ = 0;
      innerName.content.ptr = pcVar25;
      CppTypeName::addMemberTemplate
                (&genericParamType,innerName,
                 (Array<capnp::(anonymous_namespace)::CppTypeName> *)pCVar13);
      pCVar12 = (CppTypeName *)requestMethodImpl.text.content.ptr;
      lVar16 = CONCAT71(requestMethodImpl.size_._1_7_,(undefined1)requestMethodImpl.size_);
      if (lVar16 != 0) {
        requestMethodImpl.size_._0_1_ = 0;
        requestMethodImpl.size_._1_7_ = 0;
        requestMethodImpl.text.content.ptr = (char *)0x0;
        (*(code *)**(undefined8 **)requestMethodImpl.text.content.size_)
                  (requestMethodImpl.text.content.size_,lVar16,1,pCVar12,pCVar12,0);
        pCVar13 = pCVar12;
      }
      kj::str<kj::String&,char_const(&)[7]>
                ((String *)&requestMethodImpl,(kj *)&titleCase,(String *)"Params",
                 (char (*) [7])pCVar13);
      pcVar24 = requestMethodImpl.text.content.ptr;
      pcVar25 = (char *)CONCAT71(requestMethodImpl.size_._1_7_,(undefined1)requestMethodImpl.size_);
      content.size_ = (size_t)pCVar13;
      content.ptr = local_b28;
      kj::heapArray<capnp::(anonymous_namespace)::CppTypeName>
                ((Array<capnp::(anonymous_namespace)::CppTypeName> *)&resultType,pkVar21,content);
      innerName_00.content.size_ = pcVar24 + (pcVar24 == (char *)0x0);
      if (pcVar24 == (char *)0x0) {
        pcVar25 = "";
      }
      params.raw = (RawBrandedSchema *)&resultType;
      innerName_00.content.ptr = pcVar25;
      CppTypeName::addMemberTemplate
                (&paramType,innerName_00,
                 (Array<capnp::(anonymous_namespace)::CppTypeName> *)params.raw);
      pCVar13 = (CppTypeName *)resultType.name.text.content.ptr;
      sVar27 = resultType.name.size_;
      if (resultType.name.size_ != 0) {
        resultType.name.size_ = 0;
        resultType.name.text.content.ptr = (char *)0x0;
        (*(code *)**(undefined8 **)resultType.name.text.content.size_)
                  (resultType.name.text.content.size_,sVar27,0x40,pCVar13,pCVar13,
                   kj::ArrayDisposer::Dispose_<capnp::(anonymous_namespace)::CppTypeName,_false>::
                   destruct);
        params.raw = (RawBrandedSchema *)pCVar13;
      }
      pCVar13 = (CppTypeName *)requestMethodImpl.text.content.ptr;
      lVar16 = CONCAT71(requestMethodImpl.size_._1_7_,(undefined1)requestMethodImpl.size_);
      if (lVar16 != 0) {
        requestMethodImpl.size_._0_1_ = 0;
        requestMethodImpl.size_._1_7_ = 0;
        requestMethodImpl.text.content.ptr = (char *)0x0;
        (*(code *)**(undefined8 **)requestMethodImpl.text.content.size_)
                  (requestMethodImpl.text.content.size_,lVar16,1,pCVar13,pCVar13,0);
        params.raw = (RawBrandedSchema *)pCVar13;
      }
    }
  }
  else {
    requestMethodImpl.text.content.size_ = CONCAT62(method._10_6_,method.ordinal);
    requestMethodImpl.branches.disposer = (ArrayDisposer *)method.proto._reader.pointers;
    requestMethodImpl.text.content.disposer = (ArrayDisposer *)method.proto._reader.segment;
    requestMethodImpl.branches.size_ = (size_t)method.proto._reader.data;
    requestMethodImpl.branches.ptr = (Branch *)method.proto._reader.capTable;
    requestMethodImpl.text.content.ptr = (char *)method.parent.super_Schema.raw;
    requestMethodImpl.size_._0_1_ = 1;
    cppFullName(&resultType,local_b20,paramSchema.super_Schema.raw,paramSchema.super_Schema.raw,
                (Maybe<capnp::InterfaceSchema::Method> *)&requestMethodImpl);
    CppTypeName::operator=(&paramType,&resultType);
    pBVar6 = resultType.name.branches.ptr;
    if (resultType.name.branches.ptr != (Branch *)0x0) {
      uVar1 = CONCAT44(resultType.name.branches.size_._4_4_,
                       (undefined4)resultType.name.branches.size_);
      resultType.name.branches.ptr = (Branch *)0x0;
      resultType.name.branches.size_._0_4_ = 0;
      resultType.name.branches.size_._4_4_ = 0;
      (**(resultType.name.branches.disposer)->_vptr_ArrayDisposer)
                (resultType.name.branches.disposer,pBVar6,0x40,uVar1,uVar1,
                 kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    }
    sVar27 = resultType.name.text.content.size_;
    pcVar25 = resultType.name.text.content.ptr;
    if (resultType.name.text.content.ptr != (char *)0x0) {
      resultType.name.text.content.ptr = (char *)0x0;
      resultType.name.text.content.size_ = 0;
      (**(resultType.name.text.content.disposer)->_vptr_ArrayDisposer)
                (resultType.name.text.content.disposer,pcVar25,1,sVar27,sVar27,0);
    }
    requestMethodImpl.size_._0_1_ = 0;
    params = paramSchema.super_Schema.raw;
    cppFullName(&resultType,local_b20,paramSchema.super_Schema.raw,paramSchema.super_Schema.raw,
                (Maybe<capnp::InterfaceSchema::Method> *)&requestMethodImpl);
    CppTypeName::operator=(&genericParamType,&resultType);
    pBVar6 = resultType.name.branches.ptr;
    if (resultType.name.branches.ptr != (Branch *)0x0) {
      params.raw = (RawBrandedSchema *)
                   CONCAT44(resultType.name.branches.size_._4_4_,
                            (undefined4)resultType.name.branches.size_);
      resultType.name.branches.ptr = (Branch *)0x0;
      resultType.name.branches.size_._0_4_ = 0;
      resultType.name.branches.size_._4_4_ = 0;
      (**(resultType.name.branches.disposer)->_vptr_ArrayDisposer)
                (resultType.name.branches.disposer,pBVar6,0x40,params.raw,params.raw,
                 kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    }
    pCVar13 = (CppTypeName *)resultType.name.text.content.size_;
    pcVar25 = resultType.name.text.content.ptr;
    if (resultType.name.text.content.ptr != (char *)0x0) {
      resultType.name.text.content.ptr = (char *)0x0;
      resultType.name.text.content.size_ = 0;
      (**(resultType.name.text.content.disposer)->_vptr_ArrayDisposer)
                (resultType.name.text.content.disposer,pcVar25,1,pCVar13,pCVar13,0);
      params.raw = (RawBrandedSchema *)pCVar13;
    }
  }
  resultType.name.branches.disposer = (ArrayDisposer *)0x0;
  resultType.isArgDependent = false;
  resultType.needsTypename = false;
  resultType.hasInterfaces_ = false;
  resultType.hasDisambiguatedTemplate_ = false;
  resultType.name.branches.ptr = (Branch *)0x0;
  resultType.name.branches.size_._0_4_ = 0;
  resultType.name.branches.size_._4_4_ = 0;
  resultType.name.text.content.size_ = 0;
  resultType.name.text.content.disposer = (ArrayDisposer *)0x0;
  resultType.name.size_ = 0;
  resultType.name.text.content.ptr = (char *)0x0;
  genericResultType.name.branches.disposer = (ArrayDisposer *)0x0;
  genericResultType.isArgDependent = false;
  genericResultType.needsTypename = false;
  genericResultType.hasInterfaces_ = false;
  genericResultType.hasDisambiguatedTemplate_ = false;
  genericResultType.name.branches.ptr = (Branch *)0x0;
  genericResultType.name.branches.size_._0_4_ = 0;
  genericResultType.name.branches.size_._4_4_ = 0;
  genericResultType.name.text.content.size_ = 0;
  genericResultType.name.text.content.disposer = (ArrayDisposer *)0x0;
  genericResultType.name.size_ = 0;
  genericResultType.name.text.content.ptr = (char *)0x0;
  if ((resultProto._reader.dataSize < 0xc0) ||
     (*(long *)((long)resultProto._reader.data + 0x10) == 0)) {
    CppTypeName::operator=(&resultType,&interfaceTypeName);
    if (pkVar9 == pkVar21) {
      kj::str<kj::String&,char_const(&)[8]>
                ((String *)&requestMethodImpl,(kj *)&titleCase,(String *)"Results",
                 (char (*) [8])params.raw);
      if (requestMethodImpl.text.content.ptr == (char *)0x0) {
        pcVar25 = "";
      }
      else {
        pcVar25 = (char *)CONCAT71(requestMethodImpl.size_._1_7_,(undefined1)requestMethodImpl.size_
                                  );
      }
      innerName_04.content.size_ =
           requestMethodImpl.text.content.ptr + (requestMethodImpl.text.content.ptr == (char *)0x0);
      innerName_04.content.ptr = pcVar25;
      CppTypeName::addMemberType(&resultType,innerName_04);
      pCVar13 = (CppTypeName *)requestMethodImpl.text.content.ptr;
      lVar16 = CONCAT71(requestMethodImpl.size_._1_7_,(undefined1)requestMethodImpl.size_);
      if (lVar16 != 0) {
        requestMethodImpl.size_._0_1_ = 0;
        requestMethodImpl.size_._1_7_ = 0;
        requestMethodImpl.text.content.ptr = (char *)0x0;
        (*(code *)**(undefined8 **)requestMethodImpl.text.content.size_)
                  (requestMethodImpl.text.content.size_,lVar16,1,pCVar13,pCVar13,0);
        params.raw = (RawBrandedSchema *)pCVar13;
      }
      CppTypeName::operator=(&genericResultType,&resultType);
      pCVar13 = extraout_RDX_08;
    }
    else {
      CppTypeName::operator=(&genericResultType,&resultType);
      kj::str<kj::String&,char_const(&)[8]>
                ((String *)&requestMethodImpl,(kj *)&titleCase,(String *)"Results",
                 (char (*) [8])params.raw);
      if (requestMethodImpl.text.content.ptr == (char *)0x0) {
        pcVar25 = "";
      }
      else {
        pcVar25 = (char *)CONCAT71(requestMethodImpl.size_._1_7_,(undefined1)requestMethodImpl.size_
                                  );
      }
      innerName_02.content.size_ =
           requestMethodImpl.text.content.ptr + (requestMethodImpl.text.content.ptr == (char *)0x0);
      params_00 = (Array<capnp::(anonymous_namespace)::CppTypeName> *)local_b18;
      local_b18._0_8_ = (CppTypeName *)0x0;
      local_b18._8_8_ = (CppTypeName *)0x0;
      local_b18._16_8_ = (CppTypeName *)0x0;
      innerName_02.content.ptr = pcVar25;
      CppTypeName::addMemberTemplate(&genericResultType,innerName_02,params_00);
      pAVar14 = (Array<capnp::(anonymous_namespace)::CppTypeName> *)
                requestMethodImpl.text.content.ptr;
      lVar16 = CONCAT71(requestMethodImpl.size_._1_7_,(undefined1)requestMethodImpl.size_);
      if (lVar16 != 0) {
        requestMethodImpl.size_._0_1_ = 0;
        requestMethodImpl.size_._1_7_ = 0;
        requestMethodImpl.text.content.ptr = (char *)0x0;
        (*(code *)**(undefined8 **)requestMethodImpl.text.content.size_)
                  (requestMethodImpl.text.content.size_,lVar16,1,pAVar14,pAVar14,0);
        params_00 = pAVar14;
      }
      kj::str<kj::String&,char_const(&)[8]>
                ((String *)&requestMethodImpl,(kj *)&titleCase,(String *)"Results",
                 (char (*) [8])params_00);
      pcVar24 = requestMethodImpl.text.content.ptr;
      pcVar25 = (char *)CONCAT71(requestMethodImpl.size_._1_7_,(undefined1)requestMethodImpl.size_);
      content_00.size_ = (size_t)params_00;
      content_00.ptr = local_b28;
      kj::heapArray<capnp::(anonymous_namespace)::CppTypeName>
                ((Array<capnp::(anonymous_namespace)::CppTypeName> *)local_b18,pkVar21,content_00);
      innerName_03.content.size_ = pcVar24 + (pcVar24 == (char *)0x0);
      if (pcVar24 == (char *)0x0) {
        pcVar25 = "";
      }
      params.raw = (RawBrandedSchema *)local_b18;
      innerName_03.content.ptr = pcVar25;
      CppTypeName::addMemberTemplate
                (&resultType,innerName_03,
                 (Array<capnp::(anonymous_namespace)::CppTypeName> *)params.raw);
      pCVar12 = (CppTypeName *)local_b18._8_8_;
      uVar1 = local_b18._0_8_;
      pCVar13 = extraout_RDX_05;
      if ((CppTypeName *)local_b18._0_8_ != (CppTypeName *)0x0) {
        local_b18._0_8_ = (CppTypeName *)0x0;
        local_b18._8_8_ = (CppTypeName *)0x0;
        (*(code *)(((CppTypeName *)((StringTree *)local_b18._16_8_)->size_)->name).size_)
                  (local_b18._16_8_,uVar1,0x40,pCVar12,pCVar12,
                   kj::ArrayDisposer::Dispose_<capnp::(anonymous_namespace)::CppTypeName,_false>::
                   destruct);
        params.raw = (RawBrandedSchema *)pCVar12;
        pCVar13 = extraout_RDX_06;
      }
      pCVar12 = (CppTypeName *)requestMethodImpl.text.content.ptr;
      lVar16 = CONCAT71(requestMethodImpl.size_._1_7_,(undefined1)requestMethodImpl.size_);
      if (lVar16 != 0) {
        requestMethodImpl.size_._0_1_ = 0;
        requestMethodImpl.size_._1_7_ = 0;
        requestMethodImpl.text.content.ptr = (char *)0x0;
        (*(code *)**(undefined8 **)requestMethodImpl.text.content.size_)
                  (requestMethodImpl.text.content.size_,lVar16,1,pCVar12,pCVar12,0);
        params.raw = (RawBrandedSchema *)pCVar12;
        pCVar13 = extraout_RDX_07;
      }
    }
  }
  else {
    requestMethodImpl.text.content.size_ = CONCAT62(method._10_6_,method.ordinal);
    requestMethodImpl.branches.disposer = (ArrayDisposer *)method.proto._reader.pointers;
    requestMethodImpl.text.content.disposer = (ArrayDisposer *)method.proto._reader.segment;
    requestMethodImpl.branches.size_ = (size_t)method.proto._reader.data;
    requestMethodImpl.branches.ptr = (Branch *)method.proto._reader.capTable;
    requestMethodImpl.text.content.ptr = (char *)method.parent.super_Schema.raw;
    requestMethodImpl.size_._0_1_ = 1;
    cppFullName((CppTypeName *)local_b18,local_b20,resultSchema.super_Schema.raw,
                resultSchema.super_Schema.raw,
                (Maybe<capnp::InterfaceSchema::Method> *)&requestMethodImpl);
    CppTypeName::operator=(&resultType,(CppTypeName *)local_b18);
    uVar1 = local_b18._32_8_;
    if ((Branch *)local_b18._32_8_ != (Branch *)0x0) {
      pCVar13 = pCStack_af0;
      stack0xfffffffffffff508 = (undefined1  [16])0x0;
      (**local_ae8->_vptr_ArrayDisposer)
                (local_ae8,uVar1,0x40,pCVar13,pCVar13,
                 kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    }
    uVar5 = local_b18._16_8_;
    uVar1 = local_b18._8_8_;
    if ((CppTypeName *)local_b18._8_8_ != (CppTypeName *)0x0) {
      local_b18._8_8_ = (CppTypeName *)0x0;
      local_b18._16_8_ = (CppTypeName *)0x0;
      (***(_func_int ***)local_b18._24_8_)(local_b18._24_8_,uVar1,1,uVar5,uVar5,0);
    }
    requestMethodImpl.size_._0_1_ = 0;
    params = resultSchema.super_Schema.raw;
    cppFullName((CppTypeName *)local_b18,local_b20,resultSchema.super_Schema.raw,
                resultSchema.super_Schema.raw,
                (Maybe<capnp::InterfaceSchema::Method> *)&requestMethodImpl);
    CppTypeName::operator=(&genericResultType,(CppTypeName *)local_b18);
    uVar1 = local_b18._32_8_;
    pCVar13 = extraout_RDX_02;
    if ((Branch *)local_b18._32_8_ != (Branch *)0x0) {
      params.raw = (RawBrandedSchema *)pCStack_af0;
      stack0xfffffffffffff508 = (undefined1  [16])0x0;
      (**local_ae8->_vptr_ArrayDisposer)
                (local_ae8,uVar1,0x40,params.raw,params.raw,
                 kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
      pCVar13 = extraout_RDX_03;
    }
    pCVar12 = (CppTypeName *)local_b18._16_8_;
    uVar1 = local_b18._8_8_;
    if ((CppTypeName *)local_b18._8_8_ != (CppTypeName *)0x0) {
      local_b18._8_8_ = (CppTypeName *)0x0;
      local_b18._16_8_ = (CppTypeName *)0x0;
      (***(_func_int ***)local_b18._24_8_)(local_b18._24_8_,uVar1,1,pCVar12,pCVar12,0);
      params.raw = (RawBrandedSchema *)pCVar12;
      pCVar13 = extraout_RDX_04;
    }
  }
  if ((paramProto._reader.dataSize < 0xc0) || (*(long *)((long)paramProto._reader.data + 0x10) == 0)
     ) {
    kj::str<kj::String&,char_const(&)[7]>
              (&shortParamType,(kj *)&titleCase,(String *)"Params",(char (*) [7])params.raw);
    pCVar13 = extraout_RDX_10;
  }
  else {
    kj::toCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
              ((String *)&requestMethodImpl,(kj *)&genericParamType,pCVar13);
    shortParamType.content.ptr._1_7_ = requestMethodImpl.size_._1_7_;
    shortParamType.content.ptr._0_1_ = (undefined1)requestMethodImpl.size_;
    shortParamType.content.size_ = (size_t)requestMethodImpl.text.content.ptr;
    shortParamType.content.disposer = (ArrayDisposer *)requestMethodImpl.text.content.size_;
    pCVar13 = extraout_RDX_09;
  }
  if ((resultProto._reader.dataSize < 0xc0) ||
     (*(long *)((long)resultProto._reader.data + 0x10) == 0)) {
    kj::str<kj::String&,char_const(&)[8]>
              (&shortResultType,(kj *)&titleCase,(String *)"Results",(char (*) [8])params.raw);
  }
  else {
    kj::toCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
              ((String *)&requestMethodImpl,(kj *)&genericResultType,pCVar13);
    shortResultType.content.ptr._1_7_ = requestMethodImpl.size_._1_7_;
    shortResultType.content.ptr._0_1_ = (undefined1)requestMethodImpl.size_;
    shortResultType.content.size_ = (size_t)requestMethodImpl.text.content.ptr;
    shortResultType.content.disposer = (ArrayDisposer *)requestMethodImpl.text.content.size_;
  }
  requestMethodImpl.size_._0_1_ = method.parent.super_Schema.raw._0_1_;
  requestMethodImpl.size_._1_7_ = method.parent.super_Schema.raw._1_7_;
  Schema::getProto(&interfaceProto,(Schema *)&requestMethodImpl);
  if (interfaceProto._reader.dataSize < 0x40) {
    i = 0;
  }
  else {
    i = *interfaceProto._reader.data;
  }
  kj::hex(&interfaceIdHex,i);
  methodId = method.ordinal;
  TemplateContext::allDecls((StringTree *)local_b18,templateContext);
  if ((templateContext->node)._reader.dataSize < 0x121) {
    pcVar25 = "\n";
    pcVar24 = "";
  }
  else {
    bVar26 = (*(byte *)((long)(templateContext->node)._reader.data + 0x24) & 1) == 0;
    pcVar24 = "CAPNP_AUTO_IF_MSVC(";
    if (bVar26) {
      pcVar24 = "";
    }
    pcVar25 = ")\n";
    if (bVar26) {
      pcVar25 = "\n";
    }
  }
  pcVar18 = implicitParamsTemplateDecl.content.ptr;
  if (pcVar15 == (char *)0x0) {
    pcVar18 = (char *)0x0;
  }
  pcVar22 = (char *)0x0;
  if (pcVar15 != (char *)0x0) {
    pcVar22 = pcVar15 + -1;
  }
  local_a48._8_8_ = pcVar22;
  local_a48._0_8_ = pcVar18;
  local_a58._8_8_ = strlen(pcVar24);
  local_9e8._8_8_ = 0x11;
  local_9e8._0_8_ = "::capnp::Request<";
  local_a58._0_8_ = pcVar24;
  kj::toCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
            ((String *)local_998,(kj *)&paramType,value);
  local_9f8._0_8_ = ", ";
  local_9f8[8] = '\x02';
  local_9f8[9] = '\0';
  local_9f8[10] = '\0';
  local_9f8[0xb] = '\0';
  local_9f8[0xc] = '\0';
  local_9f8[0xd] = '\0';
  local_9f8[0xe] = '\0';
  local_9f8[0xf] = '\0';
  kj::toCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
            ((String *)local_9d8,(kj *)&resultType,value_00);
  local_a08._0_8_ = ">";
  local_a08._8_8_ = 1;
  local_a10 = strlen(pcVar25);
  local_a28._8_8_ = interfaceName_local.content.size_ - 1;
  local_a28._0_8_ = interfaceName_local.content.ptr;
  local_7b8._0_8_ = "::Client::";
  local_7b8._8_8_ = 10;
  local_7c8.size_ = name.content.size_ - 1;
  local_7c8.ptr = name.content.ptr;
  local_688.ptr = "Request(::kj::Maybe< ::capnp::MessageSize> sizeHint) {\n  return newCall<";
  local_688.size_ = 0x48;
  local_a28._16_8_ = pcVar25;
  kj::toCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
            ((String *)local_888,(kj *)&paramType,value_01);
  local_6a8._16_8_ = ", ";
  local_690 = 2;
  kj::toCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
            ((String *)&local_a78,(kj *)&resultType,value_02);
  local_6a8._0_8_ = ">(\n      0x";
  local_6a8._8_8_ = 0xb;
  local_6b8.ptr = interfaceIdHex.content;
  local_6b8.size_ = interfaceIdHex.currentSize;
  local_6c8.ptr = "ull, ";
  local_6c8.size_ = 5;
  local_b28 = (CppTypeName *)pcVar22;
  local_b20 = (CapnpcCppMain *)pcVar15;
  local_40 = kj::_::Stringifier::operator*((Stringifier *)&kj::_::STR,methodId);
  local_50.currentSize = 0x223a42;
  local_50.content[0] = '\x0f';
  local_50.content[1] = '\0';
  local_50.content[2] = '\0';
  local_50.content[3] = '\0';
  local_50.content[4] = '\0';
  local_50.content[5] = '\0';
  local_50.content[6] = '\0';
  local_50.content[7] = '\0';
  kj::StringTree::
  concat<kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,8ul>,kj::ArrayPtr<char_const>>
            (&requestMethodImpl,(StringTree *)local_b18,(StringTree *)local_a48,
             (ArrayPtr<const_char> *)local_a58,(ArrayPtr<const_char> *)local_9e8,
             (ArrayPtr<const_char> *)local_998,(String *)local_9f8,(ArrayPtr<const_char> *)local_9d8
             ,(String *)local_a08,(ArrayPtr<const_char> *)(local_a28 + 0x10),
             (ArrayPtr<const_char> *)local_a28,(ArrayPtr<const_char> *)local_7b8,&local_7c8,
             &local_688,(ArrayPtr<const_char> *)local_888,(String *)(local_6a8 + 0x10),
             (ArrayPtr<const_char> *)&local_a78,(String *)local_6a8,&local_6b8,&local_6c8,
             (ArrayPtr<const_char> *)&local_40,&local_50,
             (ArrayPtr<const_char> *)CONCAT26(methodId,uStack_b38));
  pSVar17 = local_a78.segment;
  if (local_a78.segment != (SegmentReader *)0x0) {
    pCVar20 = local_a78.capTable;
    local_a78.segment = (SegmentReader *)0x0;
    local_a78.capTable = (CapTableReader *)0x0;
    (**(code **)*local_a78.pointer)(local_a78.pointer,pSVar17,1,pCVar20,pCVar20,0);
  }
  uVar5 = local_888._8_8_;
  uVar1 = local_888._0_8_;
  pCVar4 = local_b20;
  pCVar13 = local_b28;
  if ((char *)local_888._0_8_ != (char *)0x0) {
    local_888._0_8_ = (char *)0x0;
    local_888._8_8_ = (char *)0x0;
    (***(_func_int ***)local_888._16_8_)(local_888._16_8_,uVar1,1,uVar5,uVar5,0);
  }
  uVar5 = local_9d8._8_8_;
  uVar1 = local_9d8._0_8_;
  if ((ArrayDisposer *)local_9d8._0_8_ != (ArrayDisposer *)0x0) {
    local_9d8._0_8_ = (ArrayDisposer *)0x0;
    local_9d8._8_8_ = (char *)0x0;
    (***(_func_int ***)local_9d8._16_8_)(local_9d8._16_8_,uVar1,1,uVar5,uVar5,0);
  }
  uVar5 = local_998._8_8_;
  uVar1 = local_998._0_8_;
  if ((char *)local_998._0_8_ != (char *)0x0) {
    local_998._0_8_ = (char *)0x0;
    local_998._8_8_ = (char *)0x0;
    (***(_func_int ***)local_998._16_8_)(local_998._16_8_,uVar1,1,uVar5,uVar5,0);
  }
  uVar1 = local_b18._32_8_;
  if ((Branch *)local_b18._32_8_ != (Branch *)0x0) {
    pCVar12 = pCStack_af0;
    stack0xfffffffffffff508 = (undefined1  [16])0x0;
    (**local_ae8->_vptr_ArrayDisposer)
              (local_ae8,uVar1,0x40,pCVar12,pCVar12,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  uVar5 = local_b18._16_8_;
  uVar1 = local_b18._8_8_;
  if ((CppTypeName *)local_b18._8_8_ != (CppTypeName *)0x0) {
    local_b18._8_8_ = (CppTypeName *)0x0;
    local_b18._16_8_ = (CppTypeName *)0x0;
    (***(_func_int ***)local_b18._24_8_)(local_b18._24_8_,uVar1,1,uVar5,uVar5,0);
  }
  __s = (ArrayDisposer *)0x2214ff;
  pcVar15 = "  ";
  local_9d8._0_8_ = "  ";
  if (pCVar4 < (char *)0x2) {
    local_9d8._0_8_ = "";
  }
  if (0x120 < (templateContext->node)._reader.dataSize) {
    bVar26 = (*(byte *)((long)(templateContext->node)._reader.data + 0x24) & 1) == 0;
    pcVar15 = "  CAPNP_AUTO_IF_MSVC(";
    if (bVar26) {
      pcVar15 = "  ";
    }
    __s = (ArrayDisposer *)0x238e75;
    if (bVar26) {
      __s = (ArrayDisposer *)0x2214ff;
    }
  }
  local_9d8._8_8_ = ZEXT48((uint)((char *)0x1 < pCVar4) * 2);
  local_888._8_8_ = pCVar13;
  local_888._0_8_ = pcVar18;
  local_a78.capTable = (CapTableReader *)strlen(pcVar15);
  local_a78.segment = (SegmentReader *)pcVar15;
  local_a48._8_8_ = 0x11;
  local_a48._0_8_ = "::capnp::Request<";
  kj::toCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
            ((String *)local_b18,(kj *)&paramType,value_03);
  local_a58._0_8_ = ", ";
  local_a58._8_8_ = (char *)0x2;
  kj::toCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
            ((String *)local_998,(kj *)&resultType,value_04);
  local_9e8._8_8_ = 1;
  local_9e8._0_8_ = ">";
  params_11 = (ArrayPtr<const_char> *)0x17c5ab;
  local_9f8._8_8_ = strlen((char *)__s);
  local_a08._0_8_ = " ";
  local_a08._8_8_ = 1;
  local_a10 = name.content.size_ - 1;
  local_a28._16_8_ = name.content.ptr;
  local_a28._0_8_ = "Request(\n      ::kj::Maybe< ::capnp::MessageSize> sizeHint = nullptr);\n";
  local_a28._8_8_ = 0x47;
  local_9f8._0_8_ = __s;
  kj::StringTree::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (&__return_storage_ptr__->clientDecls,(StringTree *)local_9d8,
             (ArrayPtr<const_char> *)local_888,(ArrayPtr<const_char> *)&local_a78,
             (ArrayPtr<const_char> *)local_a48,(ArrayPtr<const_char> *)local_b18,(String *)local_a58
             ,(ArrayPtr<const_char> *)local_998,(String *)local_9e8,
             (ArrayPtr<const_char> *)local_9f8,(ArrayPtr<const_char> *)local_a08,
             (ArrayPtr<const_char> *)(local_a28 + 0x10),(ArrayPtr<const_char> *)local_a28,params_11)
  ;
  uVar5 = local_998._8_8_;
  uVar1 = local_998._0_8_;
  pCVar13 = extraout_RDX_11;
  if ((char *)local_998._0_8_ != (char *)0x0) {
    local_998._0_8_ = (char *)0x0;
    local_998._8_8_ = (char *)0x0;
    (***(_func_int ***)local_998._16_8_)(local_998._16_8_,uVar1,1,uVar5,uVar5,0);
    pCVar13 = extraout_RDX_12;
  }
  uVar5 = local_b18._8_8_;
  uVar1 = local_b18._0_8_;
  if ((CppTypeName *)local_b18._0_8_ != (CppTypeName *)0x0) {
    local_b18._0_8_ = (CppTypeName *)0x0;
    local_b18._8_8_ = (CppTypeName *)0x0;
    (*(code *)(((CppTypeName *)((StringTree *)local_b18._16_8_)->size_)->name).size_)
              (local_b18._16_8_,uVar1,1,uVar5,uVar5,0);
    pCVar13 = extraout_RDX_13;
  }
  if ((paramProto._reader.dataSize < 0xc0) || (*(long *)((long)paramProto._reader.data + 0x10) == 0)
     ) {
    local_9d8._0_8_ = "  typedef ";
    local_9d8._8_8_ = (char *)0xa;
    kj::toCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
              ((String *)local_998,(kj *)&genericParamType,pCVar13);
    local_888._0_8_ = " ";
    local_888._8_8_ = (char *)0x1;
    local_a78.segment = (SegmentReader *)titleCase.content.size_;
    if (titleCase.content.size_ != 0) {
      local_a78.segment = (SegmentReader *)titleCase.content.ptr;
    }
    local_a78.capTable = (CapTableReader *)0;
    if (titleCase.content.size_ != 0) {
      local_a78.capTable = (CapTableReader *)(titleCase.content.size_ - 1);
    }
    local_a48._8_8_ = 8;
    local_a48._0_8_ = "Params;\n";
    kj::StringTree::
    concat<kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
              ((StringTree *)local_b18,(StringTree *)local_9d8,(ArrayPtr<const_char> *)local_998,
               (String *)local_888,(ArrayPtr<const_char> *)&local_a78,
               (ArrayPtr<const_char> *)local_a48,
               (ArrayPtr<const_char> *)CONCAT26(methodId,uStack_b38));
    uVar5 = local_998._8_8_;
    uVar1 = local_998._0_8_;
    pCVar13 = extraout_RDX_15;
    if ((char *)local_998._0_8_ != (char *)0x0) {
      local_998._0_8_ = (char *)0x0;
      local_998._8_8_ = (char *)0x0;
      (***(_func_int ***)local_998._16_8_)(local_998._16_8_,uVar1,1,uVar5,uVar5,0);
      pCVar13 = extraout_RDX_16;
    }
  }
  else {
    kj::StringTree::concat<>();
    pCVar13 = extraout_RDX_14;
  }
  if ((resultProto._reader.dataSize < 0xc0) ||
     (*(long *)((long)resultProto._reader.data + 0x10) == 0)) {
    local_888._0_8_ = "  typedef ";
    local_888._8_8_ = (char *)0xa;
    kj::toCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
              ((String *)local_9d8,(kj *)&genericResultType,pCVar13);
    local_a78.capTable = (CapTableReader *)0x1;
    local_a78.segment = (SegmentReader *)" ";
    local_a48._0_8_ = titleCase.content.size_;
    if (titleCase.content.size_ != 0) {
      local_a48._0_8_ = titleCase.content.ptr;
    }
    local_a48._8_8_ = 0;
    if (titleCase.content.size_ != 0) {
      local_a48._8_8_ = titleCase.content.size_ - 1;
    }
    local_a58._0_8_ = "Results;\n";
    local_a58._8_8_ = (char *)0x9;
    kj::StringTree::
    concat<kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
              ((StringTree *)local_998,(StringTree *)local_888,(ArrayPtr<const_char> *)local_9d8,
               (String *)&local_a78,(ArrayPtr<const_char> *)local_a48,
               (ArrayPtr<const_char> *)local_a58,
               (ArrayPtr<const_char> *)CONCAT26(methodId,uStack_b38));
    uVar5 = local_9d8._8_8_;
    uVar1 = local_9d8._0_8_;
    if ((ArrayDisposer *)local_9d8._0_8_ != (ArrayDisposer *)0x0) {
      local_9d8._0_8_ = (ArrayDisposer *)0x0;
      local_9d8._8_8_ = (char *)0x0;
      (***(_func_int ***)local_9d8._16_8_)(local_9d8._16_8_,uVar1,1,uVar5,uVar5,0);
    }
  }
  else {
    kj::StringTree::concat<>();
  }
  __return_storage_ptr___00 = &__return_storage_ptr__->serverDecls;
  kj::
  strTree<kj::StringTree,kj::StringTree,char_const(&)[32],kj::String&,char_const(&)[3],kj::String&,char_const(&)[3],kj::String&,char_const(&)[40],kj::String&,char_const(&)[2],kj::String&,char_const(&)[19]>
            (__return_storage_ptr___00,(kj *)local_b18,(StringTree *)local_998,
             (StringTree *)"  typedef ::capnp::CallContext<",(char (*) [32])&shortParamType,
             (String *)0x22212e,(char (*) [3])&shortResultType,(String *)0x221ea9,
             (char (*) [3])&titleCase,(String *)"Context;\n  virtual ::kj::Promise<void> ",
             (char (*) [40])&identifierName,(String *)0x223f9d,(char (*) [2])&titleCase,
             (String *)"Context context);\n",(char (*) [19])CONCAT26(methodId,uStack_b38));
  local_b28 = (CppTypeName *)__return_storage_ptr___00;
  if (pkVar9 == local_b30) {
    kj::StringTree::concat<>();
    local_9d8._0_8_ = CONCAT71(requestMethodImpl.size_._1_7_,(undefined1)requestMethodImpl.size_);
    local_9d8._8_8_ = requestMethodImpl.text.content.ptr;
    local_9d8._16_8_ = requestMethodImpl.text.content.size_;
    requestMethodImpl.text.content.ptr = (char *)0x0;
    requestMethodImpl.text.content.size_ = 0;
    local_9d8._24_8_ = requestMethodImpl.text.content.disposer;
    auStack_9b8._0_8_ = requestMethodImpl.branches.ptr;
    auStack_9b8._8_8_ = requestMethodImpl.branches.size_;
    pAStack_9a8 = requestMethodImpl.branches.disposer;
    requestMethodImpl.branches.ptr = (Branch *)0x0;
    requestMethodImpl.branches.size_ = 0;
  }
  else {
    (__return_storage_ptr__->inlineDefs).size_ =
         CONCAT71(requestMethodImpl.size_._1_7_,(undefined1)requestMethodImpl.size_);
    (__return_storage_ptr__->inlineDefs).text.content.ptr = requestMethodImpl.text.content.ptr;
    (__return_storage_ptr__->inlineDefs).text.content.size_ = requestMethodImpl.text.content.size_;
    requestMethodImpl.text.content.ptr = (char *)0x0;
    requestMethodImpl.text.content.size_ = 0;
    (__return_storage_ptr__->inlineDefs).text.content.disposer =
         requestMethodImpl.text.content.disposer;
    (__return_storage_ptr__->inlineDefs).branches.ptr = requestMethodImpl.branches.ptr;
    (__return_storage_ptr__->inlineDefs).branches.size_ = requestMethodImpl.branches.size_;
    (__return_storage_ptr__->inlineDefs).branches.disposer = requestMethodImpl.branches.disposer;
    requestMethodImpl.branches.ptr = (Branch *)0x0;
    requestMethodImpl.branches.size_ = 0;
    kj::StringTree::concat<>();
  }
  TemplateContext::allDecls((StringTree *)local_888,templateContext);
  bVar26 = interfaceProto._reader.pointerCount == 0;
  local_a78.pointer = interfaceProto._reader.pointers;
  if (bVar26) {
    local_a78.pointer = (WirePointer *)0x0;
  }
  local_a78.nestingLimit = 0x7fffffff;
  if (!bVar26) {
    local_a78.nestingLimit = interfaceProto._reader.nestingLimit;
  }
  local_a78.segment = (SegmentReader *)0x0;
  local_a78.capTable = (CapTableReader *)0x0;
  if (!bVar26) {
    local_a78.segment = interfaceProto._reader.segment;
    local_a78.capTable = interfaceProto._reader.capTable;
  }
  local_7c8 = (ArrayPtr<const_char>)_::PointerReader::getBlob<capnp::Text>(&local_a78,(void *)0x0,0)
  ;
  kj::
  strTree<kj::StringTree,kj::StringTree,char_const(&)[21],kj::StringPtr&,char_const(&)[11],kj::String&,char_const(&)[2],kj::String&,char_const(&)[80],capnp::Text::Reader,char_const(&)[5],kj::StringPtr&,char_const(&)[12],kj::CappedArray<char,17ul>&,char_const(&)[6],unsigned_short&,char_const(&)[6]>
            (&__return_storage_ptr__->sourceDefs,(kj *)local_9d8,(StringTree *)local_888,
             (StringTree *)0x223af6,(char (*) [21])&interfaceName_local,(StringPtr *)"::Server::",
             (char (*) [11])&identifierName,(String *)0x223f9d,(char (*) [2])&titleCase,
             (String *)
             "Context) {\n  return ::capnp::Capability::Server::internalUnimplemented(\n      \"",
             (char (*) [80])&local_7c8,(Reader *)"\", \"",(char (*) [5])&name,
             (StringPtr *)"\",\n      0x",(char (*) [12])&interfaceIdHex,
             (CappedArray<char,_17UL> *)"ull, ",(char (*) [6])&methodId,(unsigned_short *)0x2217ff,
             (char (*) [6])CONCAT26(methodId,uStack_b38));
  local_a58._0_8_ = "    case ";
  local_a58._8_8_ = (char *)0x9;
  local_9e8 = (undefined1  [16])kj::_::Stringifier::operator*((Stringifier *)&kj::_::STR,methodId);
  pCVar4 = local_b20;
  local_9f8._0_8_ = ":\n      return ";
  local_9f8[8] = '\x0f';
  local_9f8[9] = '\0';
  local_9f8[10] = '\0';
  local_9f8[0xb] = '\0';
  local_9f8[0xc] = '\0';
  local_9f8[0xd] = '\0';
  local_9f8[0xe] = '\0';
  local_9f8[0xf] = '\0';
  local_a08._0_8_ = identifierName.content.size_;
  if (identifierName.content.size_ != 0) {
    local_a08._0_8_ = identifierName.content.ptr;
  }
  local_a08._8_8_ = (CppTypeName *)0x0;
  if (identifierName.content.size_ != 0) {
    local_a08._8_8_ = (CppTypeName *)(identifierName.content.size_ - 1);
  }
  local_a28._16_8_ = "(::capnp::Capability::Server::internalGetTypedContext<\n          ";
  local_a10 = 0x41;
  kj::toCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
            ((String *)&local_a78,(kj *)&genericParamType,(CppTypeName *)local_a08._8_8_);
  local_a28._0_8_ = ", ";
  local_a28._8_8_ = 2;
  kj::toCharSequence<capnp::(anonymous_namespace)::CppTypeName&>
            ((String *)local_a48,(kj *)&genericResultType,value_05);
  local_7b8._0_8_ = ">(context));\n";
  local_7b8._8_8_ = 0xd;
  pMVar10 = (MethodText *)
            kj::StringTree::
            concat<kj::ArrayPtr<char_const>,kj::CappedArray<char,8ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>>
                      (&__return_storage_ptr__->dispatchCase,(StringTree *)local_a58,
                       (ArrayPtr<const_char> *)local_9e8,(CappedArray<char,_8UL> *)local_9f8,
                       (ArrayPtr<const_char> *)local_a08,(ArrayPtr<const_char> *)(local_a28 + 0x10),
                       (ArrayPtr<const_char> *)&local_a78,(String *)local_a28,
                       (ArrayPtr<const_char> *)local_a48,(String *)local_7b8,
                       (ArrayPtr<const_char> *)CONCAT26(methodId,uStack_b38));
  uVar1 = local_a48._0_8_;
  if ((ArrayDisposer *)local_a48._0_8_ != (ArrayDisposer *)0x0) {
    uVar5 = local_a48._8_8_;
    local_a48._0_8_ = (char *)0x0;
    local_a48._8_8_ = 0;
    pMVar10 = (MethodText *)
              (**(code **)*(size_t *)local_a48._16_8_)(local_a48._16_8_,uVar1,1,uVar5,uVar5,0);
  }
  pSVar17 = local_a78.segment;
  if (local_a78.segment != (SegmentReader *)0x0) {
    pCVar20 = local_a78.capTable;
    local_a78.segment = (SegmentReader *)0x0;
    local_a78.capTable = (CapTableReader *)0x0;
    pMVar10 = (MethodText *)
              (**(code **)*local_a78.pointer)(local_a78.pointer,pSVar17,1,pCVar20,pCVar20,0);
  }
  uVar1 = local_888._32_8_;
  if ((Branch *)local_888._32_8_ != (Branch *)0x0) {
    sVar27 = sStack_860;
    stack0xfffffffffffff798 = (undefined1  [16])0x0;
    iVar7 = (**local_858->_vptr_ArrayDisposer)
                      (local_858,uVar1,0x40,sVar27,sVar27,
                       kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    pMVar10 = (MethodText *)CONCAT44(extraout_var,iVar7);
  }
  uVar5 = local_888._16_8_;
  uVar1 = local_888._8_8_;
  if ((char *)local_888._8_8_ != (char *)0x0) {
    local_888._8_8_ = (char *)0x0;
    local_888._16_8_ = (ArrayDisposer *)0x0;
    iVar7 = (***(_func_int ***)local_888._24_8_)(local_888._24_8_,uVar1,1,uVar5,uVar5,0);
    pMVar10 = (MethodText *)CONCAT44(extraout_var_00,iVar7);
  }
  uVar1 = auStack_9b8._0_8_;
  if ((Branch *)auStack_9b8._0_8_ != (Branch *)0x0) {
    uVar5 = auStack_9b8._8_8_;
    auStack_9b8 = (undefined1  [16])0x0;
    iVar7 = (**pAStack_9a8->_vptr_ArrayDisposer)
                      (pAStack_9a8,uVar1,0x40,uVar5,uVar5,
                       kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    pMVar10 = (MethodText *)CONCAT44(extraout_var_01,iVar7);
  }
  uVar5 = local_9d8._16_8_;
  uVar1 = local_9d8._8_8_;
  if ((char *)local_9d8._8_8_ != (char *)0x0) {
    local_9d8._8_8_ = (char *)0x0;
    local_9d8._16_8_ = (ArrayDisposer *)0x0;
    iVar7 = (***(_func_int ***)local_9d8._24_8_)(local_9d8._24_8_,uVar1,1,uVar5,uVar5,0);
    pMVar10 = (MethodText *)CONCAT44(extraout_var_02,iVar7);
  }
  uVar1 = local_998._32_8_;
  if ((Branch *)local_998._32_8_ != (Branch *)0x0) {
    sVar27 = sStack_970;
    stack0xfffffffffffff688 = (undefined1  [16])0x0;
    iVar7 = (**local_968->_vptr_ArrayDisposer)
                      (local_968,uVar1,0x40,sVar27,sVar27,
                       kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    pMVar10 = (MethodText *)CONCAT44(extraout_var_03,iVar7);
  }
  uVar5 = local_998._16_8_;
  uVar1 = local_998._8_8_;
  if ((char *)local_998._8_8_ != (char *)0x0) {
    local_998._8_8_ = (char *)0x0;
    local_998._16_8_ = (ArrayDisposer *)0x0;
    iVar7 = (***(_func_int ***)local_998._24_8_)(local_998._24_8_,uVar1,1,uVar5,uVar5,0);
    pMVar10 = (MethodText *)CONCAT44(extraout_var_04,iVar7);
  }
  uVar1 = local_b18._32_8_;
  if ((Branch *)local_b18._32_8_ != (Branch *)0x0) {
    pCVar13 = pCStack_af0;
    stack0xfffffffffffff508 = (undefined1  [16])0x0;
    iVar7 = (**local_ae8->_vptr_ArrayDisposer)
                      (local_ae8,uVar1,0x40,pCVar13,pCVar13,
                       kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    pMVar10 = (MethodText *)CONCAT44(extraout_var_05,iVar7);
  }
  uVar5 = local_b18._16_8_;
  uVar1 = local_b18._8_8_;
  if ((CppTypeName *)local_b18._8_8_ != (CppTypeName *)0x0) {
    local_b18._8_8_ = (CppTypeName *)0x0;
    local_b18._16_8_ = (CppTypeName *)0x0;
    iVar7 = (***(_func_int ***)local_b18._24_8_)(local_b18._24_8_,uVar1,1,uVar5,uVar5,0);
    pMVar10 = (MethodText *)CONCAT44(extraout_var_06,iVar7);
  }
  pBVar6 = requestMethodImpl.branches.ptr;
  if (requestMethodImpl.branches.ptr != (Branch *)0x0) {
    sVar27 = requestMethodImpl.branches.size_;
    requestMethodImpl.branches.ptr = (Branch *)0x0;
    requestMethodImpl.branches.size_ = 0;
    iVar7 = (**(requestMethodImpl.branches.disposer)->_vptr_ArrayDisposer)
                      (requestMethodImpl.branches.disposer,pBVar6,0x40,sVar27,sVar27,
                       kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    pMVar10 = (MethodText *)CONCAT44(extraout_var_07,iVar7);
  }
  sVar27 = requestMethodImpl.text.content.size_;
  pcVar15 = requestMethodImpl.text.content.ptr;
  if (requestMethodImpl.text.content.ptr != (char *)0x0) {
    requestMethodImpl.text.content.ptr = (char *)0x0;
    requestMethodImpl.text.content.size_ = 0;
    iVar7 = (**(requestMethodImpl.text.content.disposer)->_vptr_ArrayDisposer)
                      (requestMethodImpl.text.content.disposer,pcVar15,1,sVar27,sVar27,0);
    pMVar10 = (MethodText *)CONCAT44(extraout_var_08,iVar7);
  }
  pcVar15 = shortResultType.content.ptr;
  if (shortResultType.content.ptr != (char *)0x0) {
    sVar27 = shortResultType.content.size_;
    shortResultType.content.ptr = (char *)0x0;
    shortResultType.content.size_ = 0;
    iVar7 = (**(shortResultType.content.disposer)->_vptr_ArrayDisposer)
                      (shortResultType.content.disposer,pcVar15,1,sVar27,sVar27,0);
    pMVar10 = (MethodText *)CONCAT44(extraout_var_09,iVar7);
  }
  pcVar15 = shortParamType.content.ptr;
  if (shortParamType.content.ptr != (char *)0x0) {
    sVar27 = shortParamType.content.size_;
    shortParamType.content.ptr = (char *)0x0;
    shortParamType.content.size_ = 0;
    iVar7 = (**(shortParamType.content.disposer)->_vptr_ArrayDisposer)
                      (shortParamType.content.disposer,pcVar15,1,sVar27,sVar27,0);
    pMVar10 = (MethodText *)CONCAT44(extraout_var_10,iVar7);
  }
  pBVar6 = genericResultType.name.branches.ptr;
  if (genericResultType.name.branches.ptr != (Branch *)0x0) {
    uVar1 = CONCAT44(genericResultType.name.branches.size_._4_4_,
                     (undefined4)genericResultType.name.branches.size_);
    genericResultType.name.branches.ptr = (Branch *)0x0;
    genericResultType.name.branches.size_._0_4_ = 0;
    genericResultType.name.branches.size_._4_4_ = 0;
    iVar7 = (**(genericResultType.name.branches.disposer)->_vptr_ArrayDisposer)
                      (genericResultType.name.branches.disposer,pBVar6,0x40,uVar1,uVar1,
                       kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    pMVar10 = (MethodText *)CONCAT44(extraout_var_11,iVar7);
  }
  sVar27 = genericResultType.name.text.content.size_;
  pcVar15 = genericResultType.name.text.content.ptr;
  if (genericResultType.name.text.content.ptr != (char *)0x0) {
    genericResultType.name.text.content.ptr = (char *)0x0;
    genericResultType.name.text.content.size_ = 0;
    iVar7 = (**(genericResultType.name.text.content.disposer)->_vptr_ArrayDisposer)
                      (genericResultType.name.text.content.disposer,pcVar15,1,sVar27,sVar27,0);
    pMVar10 = (MethodText *)CONCAT44(extraout_var_12,iVar7);
  }
  pBVar6 = resultType.name.branches.ptr;
  if (resultType.name.branches.ptr != (Branch *)0x0) {
    uVar1 = CONCAT44(resultType.name.branches.size_._4_4_,(undefined4)resultType.name.branches.size_
                    );
    resultType.name.branches.ptr = (Branch *)0x0;
    resultType.name.branches.size_._0_4_ = 0;
    resultType.name.branches.size_._4_4_ = 0;
    iVar7 = (**(resultType.name.branches.disposer)->_vptr_ArrayDisposer)
                      (resultType.name.branches.disposer,pBVar6,0x40,uVar1,uVar1,
                       kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    pMVar10 = (MethodText *)CONCAT44(extraout_var_13,iVar7);
  }
  sVar27 = resultType.name.text.content.size_;
  pcVar15 = resultType.name.text.content.ptr;
  if (resultType.name.text.content.ptr != (char *)0x0) {
    resultType.name.text.content.ptr = (char *)0x0;
    resultType.name.text.content.size_ = 0;
    iVar7 = (**(resultType.name.text.content.disposer)->_vptr_ArrayDisposer)
                      (resultType.name.text.content.disposer,pcVar15,1,sVar27,sVar27,0);
    pMVar10 = (MethodText *)CONCAT44(extraout_var_14,iVar7);
  }
  pBVar6 = genericParamType.name.branches.ptr;
  if (genericParamType.name.branches.ptr != (Branch *)0x0) {
    uVar1 = CONCAT44(genericParamType.name.branches.size_._4_4_,
                     (undefined4)genericParamType.name.branches.size_);
    genericParamType.name.branches.ptr = (Branch *)0x0;
    genericParamType.name.branches.size_._0_4_ = 0;
    genericParamType.name.branches.size_._4_4_ = 0;
    iVar7 = (**(genericParamType.name.branches.disposer)->_vptr_ArrayDisposer)
                      (genericParamType.name.branches.disposer,pBVar6,0x40,uVar1,uVar1,
                       kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    pMVar10 = (MethodText *)CONCAT44(extraout_var_15,iVar7);
  }
  sVar27 = genericParamType.name.text.content.size_;
  pcVar15 = genericParamType.name.text.content.ptr;
  if (genericParamType.name.text.content.ptr != (char *)0x0) {
    genericParamType.name.text.content.ptr = (char *)0x0;
    genericParamType.name.text.content.size_ = 0;
    iVar7 = (**(genericParamType.name.text.content.disposer)->_vptr_ArrayDisposer)
                      (genericParamType.name.text.content.disposer,pcVar15,1,sVar27,sVar27,0);
    pMVar10 = (MethodText *)CONCAT44(extraout_var_16,iVar7);
  }
  pBVar6 = paramType.name.branches.ptr;
  if (paramType.name.branches.ptr != (Branch *)0x0) {
    uVar1 = CONCAT44(paramType.name.branches.size_._4_4_,(undefined4)paramType.name.branches.size_);
    paramType.name.branches.ptr = (Branch *)0x0;
    paramType.name.branches.size_._0_4_ = 0;
    paramType.name.branches.size_._4_4_ = 0;
    iVar7 = (**(paramType.name.branches.disposer)->_vptr_ArrayDisposer)
                      (paramType.name.branches.disposer,pBVar6,0x40,uVar1,uVar1,
                       kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    pMVar10 = (MethodText *)CONCAT44(extraout_var_17,iVar7);
  }
  sVar27 = paramType.name.text.content.size_;
  pcVar15 = paramType.name.text.content.ptr;
  if (paramType.name.text.content.ptr != (char *)0x0) {
    paramType.name.text.content.ptr = (char *)0x0;
    paramType.name.text.content.size_ = 0;
    iVar7 = (**(paramType.name.text.content.disposer)->_vptr_ArrayDisposer)
                      (paramType.name.text.content.disposer,pcVar15,1,sVar27,sVar27,0);
    pMVar10 = (MethodText *)CONCAT44(extraout_var_18,iVar7);
  }
  pBVar6 = interfaceTypeName.name.branches.ptr;
  if (interfaceTypeName.name.branches.ptr != (Branch *)0x0) {
    sVar27 = interfaceTypeName.name.branches.size_;
    interfaceTypeName.name.branches.ptr = (Branch *)0x0;
    interfaceTypeName.name.branches.size_ = 0;
    iVar7 = (**(interfaceTypeName.name.branches.disposer)->_vptr_ArrayDisposer)
                      (interfaceTypeName.name.branches.disposer,pBVar6,0x40,sVar27,sVar27,
                       kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    pMVar10 = (MethodText *)CONCAT44(extraout_var_19,iVar7);
  }
  pcVar15 = interfaceTypeName.name.text.content.ptr;
  if (interfaceTypeName.name.text.content.ptr != (char *)0x0) {
    sVar27 = interfaceTypeName.name.text.content.size_;
    interfaceTypeName.name.text.content.ptr = (char *)0x0;
    interfaceTypeName.name.text.content.size_ = 0;
    iVar7 = (**(interfaceTypeName.name.text.content.disposer)->_vptr_ArrayDisposer)
                      (interfaceTypeName.name.text.content.disposer,pcVar15,1,sVar27,sVar27,0);
    pMVar10 = (MethodText *)CONCAT44(extraout_var_20,iVar7);
  }
  if (implicitParamsTemplateDecl.content.ptr != (char *)0x0) {
    iVar7 = (**(implicitParamsTemplateDecl.content.disposer)->_vptr_ArrayDisposer)
                      (implicitParamsTemplateDecl.content.disposer,
                       implicitParamsTemplateDecl.content.ptr,1,pCVar4,pCVar4,0);
    pMVar10 = (MethodText *)CONCAT44(extraout_var_21,iVar7);
  }
  if (firstElement != (kj *)0x0) {
    kj::_::HeapArrayDisposer::disposeImpl
              ((HeapArrayDisposer *)&kj::_::HeapArrayDisposer::instance,firstElement,0x40,
               (size_t)capacity,(size_t)capacity,
               kj::ArrayDisposer::Dispose_<capnp::(anonymous_namespace)::CppTypeName,_false>::
               destruct);
    pMVar10 = extraout_RAX;
  }
  pkVar9 = local_838;
  uVar1 = local_848._0_8_;
  if (local_848._0_8_ != 0) {
    uVar5 = local_848._8_8_;
    local_848 = (undefined1  [16])0x0;
    local_838 = (kj *)0x0;
    pMVar10 = (MethodText *)
              (**(code **)*local_830)
                        (local_830,uVar1,0x40,(long)(uVar5 - uVar1) >> 6,(long)pkVar9 - uVar1 >> 6,
                         kj::ArrayDisposer::
                         Dispose_<capnp::(anonymous_namespace)::CppTypeName,_false>::destruct);
  }
  pcVar15 = identifierName.content.ptr;
  if (identifierName.content.ptr != (char *)0x0) {
    sVar27 = identifierName.content.size_;
    identifierName.content.ptr = (char *)0x0;
    identifierName.content.size_ = 0;
    iVar7 = (**(identifierName.content.disposer)->_vptr_ArrayDisposer)
                      (identifierName.content.disposer,pcVar15,1,sVar27,sVar27,0);
    pMVar10 = (MethodText *)CONCAT44(extraout_var_22,iVar7);
  }
  pcVar15 = titleCase.content.ptr;
  if (titleCase.content.ptr != (char *)0x0) {
    sVar27 = titleCase.content.size_;
    titleCase.content.ptr = (char *)0x0;
    titleCase.content.size_ = 0;
    iVar7 = (**(titleCase.content.disposer)->_vptr_ArrayDisposer)
                      (titleCase.content.disposer,pcVar15,1,sVar27,sVar27,0);
    pMVar10 = (MethodText *)CONCAT44(extraout_var_23,iVar7);
  }
  return pMVar10;
}

Assistant:

MethodText makeMethodText(kj::StringPtr interfaceName, InterfaceSchema::Method method,
                            const TemplateContext& templateContext) {
    auto proto = method.getProto();
    auto name = protoName(proto);
    auto titleCase = toTitleCase(name);
    auto paramSchema = method.getParamType();
    auto resultSchema = method.getResultType();
    auto identifierName = safeIdentifier(name);

    auto paramProto = paramSchema.getProto();
    auto resultProto = resultSchema.getProto();

    auto implicitParamsReader = proto.getImplicitParameters();
    auto implicitParamsBuilder = kj::heapArrayBuilder<CppTypeName>(implicitParamsReader.size());
    for (auto param: implicitParamsReader) {
      implicitParamsBuilder.add(CppTypeName::makeTemplateParam(param.getName()));
    }
    auto implicitParams = implicitParamsBuilder.finish();

    kj::String implicitParamsTemplateDecl;
    if (implicitParams.size() > 0) {
      implicitParamsTemplateDecl = kj::str(
          "template <", kj::StringTree(KJ_MAP(p, implicitParams) {
            return kj::strTree("typename ", p);
          }, ", "), ">\n");
    }


    CppTypeName interfaceTypeName = cppFullName(method.getContainingInterface(), nullptr);
    CppTypeName paramType;
    CppTypeName genericParamType;
    if (paramProto.getScopeId() == 0) {
      paramType = interfaceTypeName;
      if (implicitParams.size() == 0) {
        paramType.addMemberType(kj::str(titleCase, "Params"));
        genericParamType = paramType;
      } else {
        genericParamType = paramType;
        genericParamType.addMemberTemplate(kj::str(titleCase, "Params"), nullptr);
        paramType.addMemberTemplate(kj::str(titleCase, "Params"),
                                    kj::heapArray(implicitParams.asPtr()));
      }
    } else {
      paramType = cppFullName(paramSchema, method);
      genericParamType = cppFullName(paramSchema, nullptr);
    }
    CppTypeName resultType;
    CppTypeName genericResultType;
    if (resultProto.getScopeId() == 0) {
      resultType = interfaceTypeName;
      if (implicitParams.size() == 0) {
        resultType.addMemberType(kj::str(titleCase, "Results"));
        genericResultType = resultType;
      } else {
        genericResultType = resultType;
        genericResultType.addMemberTemplate(kj::str(titleCase, "Results"), nullptr);
        resultType.addMemberTemplate(kj::str(titleCase, "Results"),
                                     kj::heapArray(implicitParams.asPtr()));
      }
    } else {
      resultType = cppFullName(resultSchema, method);
      genericResultType = cppFullName(resultSchema, nullptr);
    }

    kj::String shortParamType = paramProto.getScopeId() == 0 ?
        kj::str(titleCase, "Params") : kj::str(genericParamType);
    kj::String shortResultType = resultProto.getScopeId() == 0 ?
        kj::str(titleCase, "Results") : kj::str(genericResultType);

    auto interfaceProto = method.getContainingInterface().getProto();
    uint64_t interfaceId = interfaceProto.getId();
    auto interfaceIdHex = kj::hex(interfaceId);
    uint16_t methodId = method.getIndex();

    // TODO(msvc):  Notice that the return type of this method's request function is supposed to be
    // `::capnp::Request<param, result>`. If the first template parameter to ::capnp::Request is a
    // template instantiation, MSVC will sometimes complain that it's unspecialized and can't be
    // used as a parameter in the return type (error C3203). It is not clear to me under what exact
    // conditions this bug occurs, but it commonly crops up in test.capnp.h.
    //
    // The easiest (and only) workaround I found is to use C++14's return type deduction here, thus
    // the `CAPNP_AUTO_IF_MSVC()` hackery in the return type declarations below. We're depending on
    // the fact that that this function has an inline implementation for the deduction to work.

    auto requestMethodImpl = kj::strTree(
        templateContext.allDecls(),
        implicitParamsTemplateDecl,
        templateContext.isGeneric() ? "CAPNP_AUTO_IF_MSVC(" : "",
        "::capnp::Request<", paramType, ", ", resultType, ">",
        templateContext.isGeneric() ? ")\n" : "\n",
        interfaceName, "::Client::", name, "Request(::kj::Maybe< ::capnp::MessageSize> sizeHint) {\n"
        "  return newCall<", paramType, ", ", resultType, ">(\n"
        "      0x", interfaceIdHex, "ull, ", methodId, ", sizeHint);\n"
        "}\n");

    return MethodText {
      kj::strTree(
          implicitParamsTemplateDecl.size() == 0 ? "" : "  ", implicitParamsTemplateDecl,
          templateContext.isGeneric() ? "  CAPNP_AUTO_IF_MSVC(" : "  ",
          "::capnp::Request<", paramType, ", ", resultType, ">",
          templateContext.isGeneric() ? ")" : "",
          " ", name, "Request(\n"
          "      ::kj::Maybe< ::capnp::MessageSize> sizeHint = nullptr);\n"),

      kj::strTree(
          paramProto.getScopeId() != 0 ? kj::strTree() : kj::strTree(
              "  typedef ", genericParamType, " ", titleCase, "Params;\n"),
          resultProto.getScopeId() != 0 ? kj::strTree() : kj::strTree(
              "  typedef ", genericResultType, " ", titleCase, "Results;\n"),
          "  typedef ::capnp::CallContext<", shortParamType, ", ", shortResultType, "> ",
                titleCase, "Context;\n"
          "  virtual ::kj::Promise<void> ", identifierName, "(", titleCase, "Context context);\n"),

      implicitParams.size() == 0 ? kj::strTree() : kj::mv(requestMethodImpl),

      kj::strTree(
          implicitParams.size() == 0 ? kj::mv(requestMethodImpl) : kj::strTree(),
          templateContext.allDecls(),
          "::kj::Promise<void> ", interfaceName, "::Server::", identifierName, "(", titleCase, "Context) {\n"
          "  return ::capnp::Capability::Server::internalUnimplemented(\n"
          "      \"", interfaceProto.getDisplayName(), "\", \"", name, "\",\n"
          "      0x", interfaceIdHex, "ull, ", methodId, ");\n"
          "}\n"),

      kj::strTree(
          "    case ", methodId, ":\n"
          "      return ", identifierName, "(::capnp::Capability::Server::internalGetTypedContext<\n"
          "          ", genericParamType, ", ", genericResultType, ">(context));\n")
    };
  }